

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O3

TValue * cpluaopen(lua_State *L,lua_CFunction dummy,void *ud)

{
  TValue *__s;
  global_State *g;
  uint64_t uVar1;
  ulong *puVar2;
  GCtab *pGVar3;
  GCstr *pGVar4;
  
  g = (global_State *)(L->glref).ptr64;
  puVar2 = (ulong *)lj_mem_realloc(L,(void *)0x0,0,0x178);
  (L->stack).ptr64 = (uint64_t)puVar2;
  L->stacksize = 0x2f;
  (L->maxstack).ptr64 = (uint64_t)(puVar2 + 0x27);
  *puVar2 = (ulong)L | 0xfffc800000000000;
  puVar2[1] = 0xffffffffffffffff;
  __s = (TValue *)(puVar2 + 2);
  L->top = __s;
  L->base = __s;
  memset(__s,0xff,0x168);
  pGVar3 = lj_tab_new(L,0,6);
  (L->env).gcptr64 = (uint64_t)pGVar3;
  uVar1 = (L->glref).ptr64;
  pGVar3 = lj_tab_new(L,0,2);
  *(ulong *)(uVar1 + 0x110) = (ulong)pGVar3 | 0xfffa000000000000;
  lj_str_init(L);
  lj_meta_init(L);
  lj_lex_init(L);
  pGVar4 = lj_err_str(L,LJ_ERR_ERRMEM);
  pGVar4->marked = pGVar4->marked | 0x20;
  (g->gc).threshold = (g->gc).total << 2;
  lj_trace_initstate(g);
  return (TValue *)0x0;
}

Assistant:

static TValue *cpluaopen(lua_State *L, lua_CFunction dummy, void *ud)
{
  global_State *g = G(L);
  UNUSED(dummy);
  UNUSED(ud);
  stack_init(L, L);
  /* NOBARRIER: State initialization, all objects are white. */
  setgcref(L->env, obj2gco(lj_tab_new(L, 0, LJ_MIN_GLOBAL)));
  settabV(L, registry(L), lj_tab_new(L, 0, LJ_MIN_REGISTRY));
  lj_str_init(L);
  lj_meta_init(L);
  lj_lex_init(L);
  fixstring(lj_err_str(L, LJ_ERR_ERRMEM));  /* Preallocate memory error msg. */
  g->gc.threshold = 4*g->gc.total;
  lj_trace_initstate(g);
  lj_err_verify();
  return NULL;
}